

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall
AmpIO::WriteRobotLED(AmpIO *this,uint32_t rgb1,uint32_t rgb2,bool blink1,bool blink2)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  byte local_39;
  uint32_t command;
  uint8_t b2;
  uint8_t g2;
  uint8_t r2;
  uint8_t b1;
  uint8_t g1;
  uint8_t r1;
  bool blink2_local;
  bool blink1_local;
  uint32_t rgb2_local;
  uint32_t rgb1_local;
  AmpIO *this_local;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x64524131) {
    if ((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) {
      local_39 = 0;
    }
    else {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa001,
                         (ulong)((uint)((byte)(rgb1 >> 0x14) & 0xf) << 10 |
                                 (uint)((byte)(rgb1 >> 0xc) & 0xf) << 5 |
                                 (uint)((byte)(rgb1 >> 4) & 0xf) | (uint)blink1 << 0xf |
                                 (uint)((byte)(rgb2 >> 0x14) & 0xf) << 0x1a |
                                 (uint)((byte)(rgb2 >> 0xc) & 0xf) << 0x15 |
                                 (uint)((byte)(rgb2 >> 4) & 0xf) << 0x10 | (uint)blink2 << 0x1f));
      local_39 = (byte)iVar3;
    }
    this_local._7_1_ = (bool)(local_39 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WriteRobotLED(uint32_t rgb1, uint32_t rgb2, bool blink1, bool blink2) const
{
    if (GetHardwareVersion() == dRA1_String) {
        uint8_t r1 = (rgb1 >> 20) & 0xF;
        uint8_t g1 = (rgb1 >> 12) & 0xF;
        uint8_t b1 = (rgb1 >> 4) & 0xF;
        uint8_t r2 = (rgb2 >> 20) & 0xF;
        uint8_t g2 = (rgb2 >> 12) & 0xF;
        uint8_t b2 = (rgb2 >> 4) & 0xF;
        uint32_t command = (r1 << 10) | (g1 << 5) | (b1 << 0) | (blink1 << 15) | (r2 << 26) | (g2 << 21) | (b2 << 16) | (blink2 << 31) ;
        return (port ? port->WriteQuadlet(BoardId, 0xa001, command) : false);
    }
    return false;
}